

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void opengv::absolute_pose::modules::upnp_main_sym
               (Matrix<double,_10,_10,_0,_10,_10> *M,Matrix<double,_1,_10,_1,_1,_10> *C,double gamma
               ,vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                *quaternions)

{
  double dVar1;
  int q;
  long lVar2;
  const_iterator __position;
  int i;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  Vector4d quaternion;
  Matrix<double,_1,_1,_0,_1,_1> valueM;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  bad_quaternions;
  Matrix<double,_10,_1,_0,_10,_1> s;
  Matrix<std::complex<double>,_8,_8,_0,_8,_8> V;
  Matrix<double,_8,_8,_0,_8,_8> Action;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> Eig;
  Vector4d local_13c0;
  double local_1398;
  Matrix<double,_1,_10,_1,_1,_10> *local_1390;
  double local_1388;
  _Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_1380;
  undefined1 local_1360 [16];
  Matrix<double,_10,_1,_0,_10,_1> *local_1350;
  double local_1340;
  double dStack_1338;
  Matrix<double,_1,_10,_1,_1,_10> *pMStack_1330;
  double dStack_1328;
  Matrix<double,_10,_1,_0,_10,_1> *local_1320;
  Matrix<double,_10,_1,_0,_10,_1> local_1310;
  undefined1 local_12c0 [64];
  double adStack_1280 [120];
  EigenBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> local_ec0 [512];
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> local_cc0;
  
  local_1398 = gamma;
  local_1390 = C;
  upnp::setupAction_sym_gj(M,C,gamma,(Matrix<double,_8,_8,_0,_8,_8> *)local_ec0);
  Eigen::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>
            ((EigenSolver<Eigen::Matrix<double,8,8,0,8,8>> *)&local_cc0,local_ec0,true);
  Eigen::EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>::eigenvectors
            ((EigenvectorsType *)local_12c0,&local_cc0);
  local_1380._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1380._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1380._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [3] = adStack_1280[lVar3 * 0x10 + 6];
    local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [2] = adStack_1280[lVar3 * 0x10 + 4];
    local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [1] = adStack_1280[lVar3 * 0x10 + 2];
    local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [0] = adStack_1280[lVar3 * 0x10];
    dVar4 = 0.0;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      dVar1 = local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
              m_data.array[lVar2];
      dVar4 = dVar4 + dVar1 * dVar1;
    }
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar4;
      auVar5 = vsqrtsd_avx(auVar5,auVar5);
      dVar4 = auVar5._0_8_;
    }
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [lVar2] = local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[lVar2] / dVar4;
    }
    upnp_fill_s(&local_13c0,&local_1310);
    dStack_1338 = 2.0;
    pMStack_1330 = local_1390;
    local_1360._0_8_ = &local_1310;
    local_1360._8_8_ = M;
    local_1350 = &local_1310;
    local_1320 = &local_1310;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>,Eigen::Matrix<double,10,10,0,10,10>,0>,Eigen::Matrix<double,10,1,0,10,1>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,10,1,1,10>const>const,Eigen::Matrix<double,1,10,1,1,10>const>,Eigen::Matrix<double,10,1,0,10,1>,0>const>>
              ((PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>> *)&local_1388,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>_>_>
                *)local_1360);
    local_1360._0_8_ = local_1398 + local_1388;
    for (__position._M_current =
              (quaternions->
              super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
        (__position._M_current !=
         (quaternions->
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish &&
        ((__position._M_current)->first < (double)local_1360._0_8_));
        __position._M_current = __position._M_current + 1) {
    }
    local_1340 = local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                 m_data.array[0];
    dStack_1338 = local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[1];
    pMStack_1330 = (Matrix<double,_1,_10,_1,_1,_10> *)
                   local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                   .m_data.array[2];
    dStack_1328 = local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[3];
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::_M_insert_rval(quaternions,__position,(value_type *)local_1360);
  }
  if ((quaternions->
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (quaternions->
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::operator=(quaternions,
                (vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 *)&local_1380);
  }
  std::
  _Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::~_Vector_base(&local_1380);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::upnp_main_sym(
    const Eigen::Matrix<double,10,10> & M,
    const Eigen::Matrix<double,1,10> & C,
    double gamma,
    std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > & quaternions )
{
  Eigen::Matrix<double,8,8> Action;
  upnp::setupAction_sym_gj( M, C, gamma, Action );
  Eigen::EigenSolver< Eigen::Matrix<double,8,8> > Eig( Action, true );
  Eigen::Matrix<std::complex<double>,8,8> V = Eig.eigenvectors();
  
  //ok, let's cut the imaginary solutions (with a reasonable threshold!)
  // const double imagThreshold = 0.01;
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > bad_quaternions;
  
  for( int i = 0; i < 8; i++ )
  {
    Eigen::Vector4d quaternion;
    quaternion[3] = V(7,i).real();
    quaternion[2] = V(6,i).real();
    quaternion[1] = V(5,i).real();
    quaternion[0] = V(4,i).real();
    
    double norm = 0.0;
    for( int q = 0; q < 4; q++ )
      norm += pow(quaternion[q],2.0);
    norm = sqrt(norm);
    for( int q = 0; q < 4; q++ )
      quaternion[q] /= norm;
    
    Eigen::Matrix<double,10,1> s;
    upnp_fill_s(quaternion,s);
    Eigen::Matrix<double,1,1> valueM = s.transpose() * M * s + 2.0 * C * s;
    double value = valueM[0] + gamma;

    if( true )//fabs(D[i].imag()) < imagThreshold ) //use all results for the moment
    {
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = quaternions.begin();
      while( qidx != quaternions.end() && qidx->first < value )
        qidx++;
      
      quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
    else
    {
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = bad_quaternions.begin();
      while( qidx != bad_quaternions.end() && qidx->first < value )
        qidx++;
      
      bad_quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
  }
  if( quaternions.size() == 0 )
    quaternions = bad_quaternions;
}